

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode UA_Server_removeRepeatedJob(UA_Server *server,UA_Guid jobId)

{
  RepeatedJob *pRVar1;
  RepeatedJob **ppRVar2;
  UA_Boolean UVar3;
  RepeatedJob *__ptr;
  undefined1 local_30 [8];
  UA_Guid jobId_local;
  
  jobId_local._0_8_ = jobId.data4;
  local_30 = jobId._0_8_;
  pRVar1 = (server->repeatedJobs).lh_first;
  do {
    __ptr = pRVar1;
    if (__ptr == (RepeatedJob *)0x0) {
      return 0;
    }
    pRVar1 = (__ptr->next).le_next;
    UVar3 = UA_Guid_equal((UA_Guid *)local_30,&__ptr->id);
  } while (!UVar3);
  ppRVar2 = (__ptr->next).le_prev;
  if (pRVar1 != (RepeatedJob *)0x0) {
    (pRVar1->next).le_prev = ppRVar2;
  }
  *ppRVar2 = pRVar1;
  free(__ptr);
  return 0;
}

Assistant:

UA_StatusCode UA_Server_removeRepeatedJob(UA_Server *server, UA_Guid jobId) {
#ifdef UA_ENABLE_MULTITHREADING
    UA_Guid *idptr = UA_malloc(sizeof(UA_Guid));
    if(!idptr)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    *idptr = jobId;
    // dispatch to the mainloopjobs stack
    struct MainLoopJob *mlw = UA_malloc(sizeof(struct MainLoopJob));
    mlw->job = (UA_Job) {
        .type = UA_JOBTYPE_METHODCALL,
        .job.methodCall = {.data = idptr, .method = (void (*)(UA_Server*, void*))removeRepeatedJob}};
    cds_lfs_push(&server->mainLoopJobs, &mlw->node);
#else
    removeRepeatedJob(server, &jobId);
#endif
    return UA_STATUSCODE_GOOD;
}